

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

boolean herb_can_grow_at(level *lev,xchar x,xchar y,boolean watery)

{
  byte bVar1;
  uint uVar2;
  char cVar3;
  boolean watery_00;
  long lVar4;
  undefined7 in_register_00000011;
  int iVar5;
  undefined7 in_register_00000031;
  int iVar6;
  
  cVar3 = inside_shop(lev,x,y);
  if (cVar3 == '\0') {
    iVar6 = (int)CONCAT71(in_register_00000031,x);
    iVar5 = (int)CONCAT71(in_register_00000011,y);
    if (watery == '\0') {
      uVar2 = *(uint *)&lev->locations[iVar6][iVar5].field_0x6;
      if ((uVar2 >> 10 & 1) != 0) {
        bVar1 = lev->locations[iVar6][iVar5].typ;
        watery_00 = '\0';
        if (1 < bVar1 - 0x18) {
          if (bVar1 != 0x17) {
            return '\0';
          }
          watery_00 = '\0';
          if (0x2f < (uVar2 & 0x1f0)) {
            return '\0';
          }
        }
        goto LAB_001adc51;
      }
    }
    else {
      watery_00 = '\x01';
      if ((byte)(lev->locations[iVar6][iVar5].typ - 0x11U) < 4) {
LAB_001adc51:
        lVar4 = count_herbs_at(lev,x,y,watery_00);
        return lVar4 < 3;
      }
    }
  }
  return '\0';
}

Assistant:

static boolean herb_can_grow_at(struct level *lev, xchar x, xchar y, boolean watery)
{
	struct rm *loc = &lev->locations[x][y];
	if (inside_shop(lev, x, y))
	    return FALSE;
	if (watery)
	    return IS_POOL(loc->typ) &&
		   count_herbs_at(lev, x, y, watery) < HERB_GROWTH_LIMIT;
	return loc->lit &&
	       (loc->typ == ROOM || loc->typ == CORR ||
		(IS_DOOR(loc->typ) &&
		 (loc->doormask == D_NODOOR ||
		  loc->doormask == D_ISOPEN ||
		  loc->doormask == D_BROKEN))) &&
	       count_herbs_at(lev, x, y, watery) < HERB_GROWTH_LIMIT;
}